

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<int,duckdb::QuantileStandardType>,int,duckdb::QuantileListOperation<int,false>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  iterator iVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  data_ptr_t pdVar9;
  ulong uVar10;
  AggregateUnaryInput input_data;
  int local_9c;
  ulong local_98;
  data_ptr_t local_90;
  ulong local_88;
  Vector *local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar9 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      local_88 = count + 0x3f >> 6;
      uVar6 = 0;
      uVar10 = 0;
      local_90 = pdVar9;
      local_80 = input;
      do {
        pdVar4 = local_90;
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar5 = 0xffffffffffffffff;
        }
        else {
          uVar5 = puVar1[uVar6];
        }
        uVar7 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar7 = count;
        }
        uVar8 = uVar7;
        if (uVar5 != 0) {
          uVar8 = uVar10;
          local_98 = uVar6;
          if (uVar5 == 0xffffffffffffffff) {
            if (uVar10 < uVar7) {
              do {
                local_78.sel = (SelectionVector *)
                               CONCAT44(local_78.sel._4_4_,*(int *)(pdVar9 + uVar10 * 4));
                iVar3._M_current = *(int **)(state + 8);
                if (iVar3._M_current == *(int **)(state + 0x10)) {
                  ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)state,iVar3,(int *)&local_78);
                }
                else {
                  *iVar3._M_current = *(int *)(pdVar9 + uVar10 * 4);
                  *(int **)(state + 8) = iVar3._M_current + 1;
                }
                uVar10 = uVar10 + 1;
                uVar8 = uVar10;
              } while (uVar7 != uVar10);
            }
          }
          else {
            pdVar9 = local_90;
            if (uVar10 < uVar7) {
              uVar8 = 0;
              do {
                if ((uVar5 >> (uVar8 & 0x3f) & 1) != 0) {
                  local_78.sel = (SelectionVector *)
                                 CONCAT44(local_78.sel._4_4_,
                                          *(int *)(pdVar4 + uVar8 * 4 + uVar10 * 4));
                  iVar3._M_current = *(int **)(state + 8);
                  if (iVar3._M_current == *(int **)(state + 0x10)) {
                    ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              ((vector<int,_std::allocator<int>_> *)state,iVar3,(int *)&local_78);
                  }
                  else {
                    *iVar3._M_current = *(int *)(pdVar4 + uVar8 * 4 + uVar10 * 4);
                    *(int **)(state + 8) = iVar3._M_current + 1;
                  }
                }
                uVar8 = uVar8 + 1;
              } while ((uVar10 - uVar7) + uVar8 != 0);
              uVar6 = local_98;
              input = local_80;
              pdVar9 = local_90;
              uVar8 = uVar10 + uVar8;
            }
          }
        }
        uVar6 = uVar6 + 1;
        uVar10 = uVar8;
      } while (uVar6 != local_88);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      QuantileOperation::
      ConstantOperation<int,duckdb::QuantileState<int,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<int,false>>
                ((QuantileState<int,_duckdb::QuantileStandardType> *)state,(int *)input->data,
                 (AggregateUnaryInput *)&local_78,count);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar2 = (local_78.sel)->sel_vector;
        uVar6 = 0;
        do {
          uVar10 = uVar6;
          if (psVar2 != (sel_t *)0x0) {
            uVar10 = (ulong)psVar2[uVar6];
          }
          local_9c = *(int *)(local_78.data + uVar10 * 4);
          iVar3._M_current = *(int **)(state + 8);
          if (iVar3._M_current == *(int **)(state + 0x10)) {
            ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)state,iVar3,&local_9c);
          }
          else {
            *iVar3._M_current = local_9c;
            *(int **)(state + 8) = iVar3._M_current + 1;
          }
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
    }
    else if (count != 0) {
      psVar2 = (local_78.sel)->sel_vector;
      uVar6 = 0;
      do {
        uVar10 = uVar6;
        if (psVar2 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar2[uVar6];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar10 >> 6]
             >> (uVar10 & 0x3f) & 1) != 0)) {
          local_9c = *(int *)(local_78.data + uVar10 * 4);
          iVar3._M_current = *(int **)(state + 8);
          if (iVar3._M_current == *(int **)(state + 0x10)) {
            ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)state,iVar3,&local_9c);
          }
          else {
            *iVar3._M_current = local_9c;
            *(int **)(state + 8) = iVar3._M_current + 1;
          }
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}